

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O0

Am_Wrapper * Am_Get_Computed_Colors_Record_Form_proc(Am_Object *self)

{
  bool bVar1;
  Am_ID_Tag AVar2;
  Am_Value *pAVar3;
  Am_Ptr ptr;
  bool local_99;
  Computed_Colors_Record local_58;
  Am_Drawonable *local_50;
  Am_Drawonable *draw;
  Am_Object window;
  bool is_color;
  undefined1 local_30 [8];
  Am_Value value;
  Am_Style foreground_color;
  Am_Object *self_local;
  
  Am_Style::Am_Style((Am_Style *)&value.value);
  Am_Value::Am_Value((Am_Value *)local_30);
  window.data._3_1_ = 1;
  pAVar3 = Am_Object::Peek(self,0x6a,0);
  Am_Value::operator=((Am_Value *)local_30,pAVar3);
  AVar2 = Am_Type_Class(local_30._0_2_);
  if (AVar2 == 0x2000) {
    Am_Style::operator=((Am_Style *)&value.value,(Am_Value *)local_30);
  }
  Am_Object::Am_Object((Am_Object *)&draw);
  pAVar3 = Am_Object::Get(self,0x68,0);
  Am_Object::operator=((Am_Object *)&draw,pAVar3);
  bVar1 = Am_Object::Valid((Am_Object *)&draw);
  if (bVar1) {
    pAVar3 = Am_Object::Get((Am_Object *)&draw,0x7d2,0);
    ptr = Am_Value::operator_cast_to_void_(pAVar3);
    local_50 = Am_Drawonable::Narrow(ptr);
    local_99 = true;
    if (local_50 != (Am_Drawonable *)0x0) {
      local_99 = Am_Drawonable::Is_Color(local_50);
    }
    window.data._3_1_ = local_99;
  }
  if ((window.data._3_1_ & 1) == 0) {
    self_local = (Am_Object *)
                 Computed_Colors_Record::operator_cast_to_Am_Wrapper_(&black_and_white_rec);
  }
  else {
    Computed_Colors_Record::Computed_Colors_Record(&local_58,(Am_Style *)&value.value);
    self_local = (Am_Object *)Computed_Colors_Record::operator_cast_to_Am_Wrapper_(&local_58);
    Computed_Colors_Record::~Computed_Colors_Record(&local_58);
  }
  Am_Object::~Am_Object((Am_Object *)&draw);
  Am_Value::~Am_Value((Am_Value *)local_30);
  Am_Style::~Am_Style((Am_Style *)&value.value);
  return (Am_Wrapper *)self_local;
}

Assistant:

Am_Define_Formula(Am_Wrapper *, Am_Get_Computed_Colors_Record_Form)
{
  Am_Style foreground_color;
  Am_Value value;
  bool is_color = true;
  value = self.Peek(Am_FILL_STYLE);
  if (Am_Type_Class(value.type) == Am_WRAPPER)
    foreground_color = value;
  Am_Object window;
  window = self.Get(Am_WINDOW);
  if (window.Valid()) {
    Am_Drawonable *draw = Am_Drawonable::Narrow(window.Get(Am_DRAWONABLE));
    is_color = !draw || draw->Is_Color();
  }
  if (is_color)
    return Computed_Colors_Record(foreground_color);
  else
    return black_and_white_rec;
}